

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

void __thiscall
notch::core::FullyConnectedLayer::calcLocalGrad(FullyConnectedLayer *this,Array *errors)

{
  size_t sVar1;
  float *x_begin;
  float *y_begin;
  float *z_begin;
  float *y_end;
  float *z_end;
  float *x_end;
  bool bVar2;
  
  sVar1 = (this->activationGrad)._M_size;
  if (sVar1 != errors->_M_size) {
    __assert_fail("activationGrad.size() == errors.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x5bb,"void notch::FullyConnectedLayer::calcLocalGrad(const Array &)");
  }
  if ((this->localGrad)._M_size != sVar1) {
    __assert_fail("localGrad.size() == errors.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x5bc,"void notch::FullyConnectedLayer::calcLocalGrad(const Array &)");
  }
  bVar2 = sVar1 == 0;
  x_begin = (this->activationGrad)._M_data;
  x_end = x_begin + sVar1;
  if (bVar2) {
    x_end = (float *)0x0;
    x_begin = (float *)0x0;
  }
  y_begin = errors->_M_data;
  y_end = y_begin + sVar1;
  if (bVar2) {
    y_end = (float *)0x0;
    y_begin = (float *)0x0;
  }
  z_begin = (this->localGrad)._M_data;
  z_end = z_begin + sVar1;
  if (bVar2) {
    z_end = (float *)0x0;
    z_begin = (float *)0x0;
  }
  internal::emul<float*,float_const*,float*>(x_begin,x_end,y_begin,y_end,z_begin,z_end);
  return;
}

Assistant:

void calcLocalGrad(const Array &errors) {
        assert(activationGrad.size() == errors.size());
        assert(localGrad.size() == errors.size());
#ifdef NOTCH_DISABLE_OPTIMIZATIONS
        localGrad = activationGrad * errors;
#else /* optimized version */
        internal::emul(std::begin(activationGrad), std::end(activationGrad),
                       std::begin(errors), std::end(errors),
                       std::begin(localGrad), std::end(localGrad));
#endif
    }